

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::ExtendBuffer
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t newLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint *puVar4;
  uint local_28;
  uint local_24;
  Data *pDStack_20;
  charcount_t newLengthTryGrowPolicy;
  Data *newChunk;
  StringBuilder<Memory::ArenaAllocator> *pSStack_10;
  charcount_t newLength_local;
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  newChunk._4_4_ = newLength;
  pSStack_10 = this;
  if (0x7ffffffe < newLength) {
    Throw::OutOfMemory();
  }
  if (0x7ffffffe < this->length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x74,"(this->length <= MaxLength)","this->length <= MaxLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_24 = newChunk._4_4_ + (this->length << 1) / 3;
  if (local_24 < 0x7fffffff) {
    newChunk._4_4_ = local_24;
  }
  if (0x7ffffffe < newChunk._4_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x7b,"(newLength <= MaxLength)","newLength <= MaxLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsChained(this);
  if ((bVar2) || ((this->firstChunk != (Data *)0x0 && (0x40 < newChunk._4_4_ - this->length)))) {
    pDStack_20 = NewChainedChunk(this,newChunk._4_4_ - this->count);
    bVar2 = IsChained(this);
    if (bVar2) {
      (this->lastChunk->u).chained.next = pDStack_20;
      if ((this->lastChunk->u).chained.length <= this->length - this->count) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                    ,0x87,
                                    "(this->lastChunk->u.chained.length > this->length - this->count)"
                                    ,
                                    "this->lastChunk->u.chained.length > this->length - this->count"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      (this->lastChunk->u).chained.length =
           (this->lastChunk->u).chained.length - (this->length - this->count);
    }
    else {
      if (this->secondChunk != (Data *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                    ,0x8d,"(this->secondChunk == 0)","this->secondChunk == NULL");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this->secondChunk = pDStack_20;
      this->firstChunkLength = this->count;
    }
    this->length = this->count + (pDStack_20->u).chained.length;
    this->lastChunk = pDStack_20;
    this->appendPtr = (char16 *)(pDStack_20 + 1);
  }
  else {
    if (this->initialSize < 0x7ffffffe) {
      local_28 = this->initialSize + 1;
      puVar4 = max<unsigned_int>((uint *)((long)&newChunk + 4),&local_28);
      newChunk._4_4_ = *puVar4;
    }
    else {
      newChunk._4_4_ = 0x7ffffffe;
    }
    if (0x7ffffffe < newChunk._4_4_) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                  ,0xa2,"(newLength <= MaxLength)","newLength <= MaxLength");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pDStack_20 = NewSingleChunk(this,(charcount_t *)((long)&newChunk + 4));
    if (this->count != 0) {
      js_wmemcpy_s((char16 *)pDStack_20,(ulong)newChunk._4_4_,(char16 *)this->firstChunk,
                   (ulong)this->count);
    }
    this->lastChunk = pDStack_20;
    this->firstChunk = pDStack_20;
    this->firstChunkLength = newChunk._4_4_;
    this->length = newChunk._4_4_;
    this->appendPtr = (char16 *)((long)&pDStack_20->u + (ulong)this->count * 2);
  }
  return;
}

Assistant:

_NOINLINE void ExtendBuffer(charcount_t newLength)
        {
            Data *newChunk;

            // To maintain this->length under MaxLength, check it here/throw, this is the only place we grow the buffer.
            if (newLength > MaxLength)
            {
                Throw::OutOfMemory();
            }

            Assert(this->length <= MaxLength);

            charcount_t newLengthTryGrowPolicy = newLength + (this->length*2/3); // Note: this would never result in uint32 overflow.
            if (newLengthTryGrowPolicy <= MaxLength)
            {
                newLength = newLengthTryGrowPolicy;
            }
            Assert(newLength <= MaxLength);

            // We already have linked chunks
            if (this->IsChained() || (this->firstChunk != NULL && newLength - this->length > MaxRealloc))
            {
                newChunk = this->NewChainedChunk(newLength - this->count);

                if (this->IsChained())
                {
                    this->lastChunk->u.chained.next = newChunk;

                    // We're not going to use the extra space in the current chunk...
                    Assert(this->lastChunk->u.chained.length > this->length - this->count);
                    this->lastChunk->u.chained.length -= (this->length - this->count);
                }
                else
                {
                    // Time to add our first linked chunk
                    Assert(this->secondChunk == NULL);
                    this->secondChunk = newChunk;

                    // We're not going to use the extra space in the current chunk...
                    this->firstChunkLength = this->count;
                }

                this->length = this->count + newChunk->u.chained.length;
                this->lastChunk = newChunk;
                this->appendPtr = newChunk->u.chained.buffer;
            }
            else
            {
                if (this->initialSize < MaxLength)
                {
                    newLength = max(newLength, this->initialSize + 1);
                }
                else
                {
                    newLength = MaxLength;
                }
                Assert(newLength <= MaxLength);

                // Let's just grow the current chunk in place
                newChunk = this->NewSingleChunk(&newLength);

                if (this->count)
                {
                    js_wmemcpy_s(newChunk->u.single.buffer, newLength, this->firstChunk->u.single.buffer, this->count);
                }

                this->firstChunk = this->lastChunk = newChunk;
                this->firstChunkLength = newLength;
                this->length = newLength;
                this->appendPtr = newChunk->u.single.buffer + this->count;
            }
        }